

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

BSDF * __thiscall
pbrt::ThinDielectricMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,ThinDielectricMaterial *this,SampledWavelengths *param_3,
          Float *param_4,undefined8 param_5,undefined8 param_6,undefined8 param_7,undefined8 param_8
          ,undefined8 param_9,undefined8 param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14)

{
  float fVar1;
  ulong uVar2;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  uintptr_t iptr;
  Float eta;
  SampledSpectrum SVar3;
  UniversalTextureEvaluator local_61;
  BxDFHandle local_60;
  uintptr_t local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  uVar2 = (this->etaF).
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  if ((uVar2 & 0xffffffffffff) == 0) {
    local_58 = (this->etaS).
               super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
    local_48 = *(undefined8 *)(param_3->lambda).values;
    uStack_40 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_38 = *(undefined8 *)(param_3->pdf).values;
    uStack_30 = *(undefined8 *)((param_3->pdf).values + 2);
    ctx_00._8_8_ = param_8;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx_00._32_8_ = param_11;
    ctx_00._40_8_ = param_12;
    ctx_00._48_8_ = param_13;
    ctx_00._56_8_ = param_14;
    SVar3 = UniversalTextureEvaluator::operator()
                      (&local_61,(SpectrumTextureHandle)&local_58,ctx_00,*param_3);
    eta = SVar3.values.values[0];
    if (((((param_3->pdf).values[1] != 0.0) || (fVar1 = (param_3->pdf).values[2], fVar1 != 0.0)) ||
        (NAN(fVar1))) || ((fVar1 = (param_3->pdf).values[3], fVar1 != 0.0 || (NAN(fVar1))))) {
      (param_3->pdf).values[3] = 0.0;
      (param_3->pdf).values[1] = 0.0;
      (param_3->pdf).values[2] = 0.0;
      (param_3->pdf).values[0] = (param_3->pdf).values[0] * 0.25;
    }
  }
  else {
    ctx._8_8_ = param_8;
    ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx._32_8_ = param_11;
    ctx._40_8_ = param_12;
    ctx._48_8_ = param_13;
    ctx._56_8_ = param_14;
    local_50 = uVar2;
    eta = UniversalTextureEvaluator::operator()(&local_61,(FloatTextureHandle)&local_50,ctx);
  }
  *param_4 = eta;
  local_60.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_4 | 0x6000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_60,eta);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda,
                              ThinDielectricBxDF *bxdf) const {
        // Compute index of refraction for dielectric material
        Float eta;
        if (etaF)
            eta = texEval(etaF, ctx);
        else {
            eta = texEval(etaS, ctx, lambda)[0];
            lambda.TerminateSecondary();
        }

        // Return BSDF for \use{ThinDielectricMaterial}
        *bxdf = ThinDielectricBxDF(eta);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }